

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O0

int cubeb_init(cubeb **context,char *context_name,char *backend_name)

{
  int iVar1;
  char *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int i;
  _func_int_cubeb_ptr_ptr_char_ptr *default_init [4];
  _func_int_cubeb_ptr_ptr_char_ptr *init_oneshot;
  int local_4c;
  code *local_48 [4];
  code *local_28;
  char *local_20;
  undefined8 local_18;
  long local_10;
  int local_4;
  
  local_28 = (code *)0x0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RDX != (char *)0x0) {
    local_20 = in_RDX;
    iVar1 = strcmp(in_RDX,"pulse");
    if (iVar1 == 0) {
      local_28 = pulse_init;
    }
    else {
      iVar1 = strcmp(local_20,"pulse-rust");
      if ((iVar1 != 0) && (iVar1 = strcmp(local_20,"jack"), iVar1 != 0)) {
        iVar1 = strcmp(local_20,"alsa");
        if (iVar1 == 0) {
          local_28 = alsa_init;
        }
        else {
          iVar1 = strcmp(local_20,"audiounit");
          if ((((iVar1 != 0) && (iVar1 = strcmp(local_20,"audiounit-rust"), iVar1 != 0)) &&
              (iVar1 = strcmp(local_20,"wasapi"), iVar1 != 0)) &&
             (iVar1 = strcmp(local_20,"winmm"), iVar1 != 0)) {
            iVar1 = strcmp(local_20,"sndio");
            if (iVar1 == 0) {
              local_28 = sndio_init;
            }
            else {
              iVar1 = strcmp(local_20,"sun");
              if (((iVar1 != 0) && (iVar1 = strcmp(local_20,"opensl"), iVar1 != 0)) &&
                 ((iVar1 = strcmp(local_20,"oss"), iVar1 != 0 &&
                  ((iVar1 = strcmp(local_20,"aaudio"), iVar1 != 0 &&
                   (iVar1 = strcmp(local_20,"audiotrack"), iVar1 != 0)))))) {
                strcmp(local_20,"kai");
              }
            }
          }
        }
      }
    }
  }
  local_48[0] = local_28;
  local_48[1] = pulse_init;
  local_48[2] = sndio_init;
  local_48[3] = alsa_init;
  if (local_10 == 0) {
    local_4 = -3;
  }
  else {
    for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
      if ((local_48[local_4c] != (code *)0x0) &&
         (iVar1 = (*local_48[local_4c])(local_10,local_18), iVar1 == 0)) {
        return 0;
      }
    }
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int
cubeb_init(cubeb ** context, char const * context_name, char const * backend_name)
{
  int (* init_oneshot)(cubeb **, char const *) = NULL;

  if (backend_name != NULL) {
    if (!strcmp(backend_name, "pulse")) {
#if defined(USE_PULSE)
      init_oneshot = pulse_init;
#endif
    } else if (!strcmp(backend_name, "pulse-rust")) {
#if defined(USE_PULSE_RUST)
      init_oneshot = pulse_rust_init;
#endif
    } else if (!strcmp(backend_name, "jack")) {
#if defined(USE_JACK)
      init_oneshot = jack_init;
#endif
    } else if (!strcmp(backend_name, "alsa")) {
#if defined(USE_ALSA)
      init_oneshot = alsa_init;
#endif
    } else if (!strcmp(backend_name, "audiounit")) {
#if defined(USE_AUDIOUNIT)
      init_oneshot = audiounit_init;
#endif
    } else if (!strcmp(backend_name, "audiounit-rust")) {
#if defined(USE_AUDIOUNIT_RUST)
      init_oneshot = audiounit_rust_init;
#endif
    } else if (!strcmp(backend_name, "wasapi")) {
#if defined(USE_WASAPI)
      init_oneshot = wasapi_init;
#endif
    } else if (!strcmp(backend_name, "winmm")) {
#if defined(USE_WINMM)
      init_oneshot = winmm_init;
#endif
    } else if (!strcmp(backend_name, "sndio")) {
#if defined(USE_SNDIO)
      init_oneshot = sndio_init;
#endif
    } else if (!strcmp(backend_name, "sun")) {
#if defined(USE_SUN)
      init_oneshot = sun_init;
#endif
    } else if (!strcmp(backend_name, "opensl")) {
#if defined(USE_OPENSL)
      init_oneshot = opensl_init;
#endif
    } else if (!strcmp(backend_name, "oss")) {
#if defined(USE_OSS)
      init_oneshot = oss_init;
#endif
    } else if (!strcmp(backend_name, "aaudio")) {
#if defined(USE_AAUDIO)
      init_oneshot = aaudio_init;
#endif
    } else if (!strcmp(backend_name, "audiotrack")) {
#if defined(USE_AUDIOTRACK)
      init_oneshot = audiotrack_init;
#endif
    } else if (!strcmp(backend_name, "kai")) {
#if defined(USE_KAI)
      init_oneshot = kai_init;
#endif
    } else {
      /* Already set */
    }
  }

  int (* default_init[])(cubeb **, char const *) = {
    /*
     * init_oneshot must be at the top to allow user
     * to override all other choices
     */
    init_oneshot,
#if defined(USE_PULSE_RUST)
    pulse_rust_init,
#endif
#if defined(USE_PULSE)
    pulse_init,
#endif
#if defined(USE_JACK)
    jack_init,
#endif
#if defined(USE_SNDIO)
    sndio_init,
#endif
#if defined(USE_ALSA)
    alsa_init,
#endif
#if defined (USE_OSS)
    oss_init,
#endif
#if defined(USE_AUDIOUNIT_RUST)
    audiounit_rust_init,
#endif
#if defined(USE_AUDIOUNIT)
    audiounit_init,
#endif
#if defined(USE_WASAPI)
    wasapi_init,
#endif
#if defined(USE_WINMM)
    winmm_init,
#endif
#if defined(USE_SUN)
    sun_init,
#endif
#if defined(USE_OPENSL)
    opensl_init,
#endif
    // TODO: should probably be preferred over OpenSLES when available.
    // Initialization will fail on old android devices.
#if defined(USE_AAUDIO)
    aaudio_init,
#endif
#if defined(USE_AUDIOTRACK)
    audiotrack_init,
#endif
#if defined(USE_KAI)
    kai_init,
#endif
  };
  int i;

  if (!context) {
    return CUBEB_ERROR_INVALID_PARAMETER;
  }

#define OK(fn) assert((* context)->ops->fn)
  for (i = 0; i < NELEMS(default_init); ++i) {
    if (default_init[i] && default_init[i](context, context_name) == CUBEB_OK) {
      /* Assert that the minimal API is implemented. */
      OK(get_backend_id);
      OK(destroy);
      OK(stream_init);
      OK(stream_destroy);
      OK(stream_start);
      OK(stream_stop);
      OK(stream_get_position);
      return CUBEB_OK;
    }
  }
  return CUBEB_ERROR;
}